

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerMSL::is_intersection_query(CompilerMSL *this)

{
  Capability *pCVar1;
  Capability *pCVar2;
  Capability local_1c;
  SmallVector<spv::Capability,_8UL> *local_18;
  SmallVector<spv::Capability,_8UL> *caps;
  CompilerMSL *this_local;
  
  caps = (SmallVector<spv::Capability,_8UL> *)this;
  local_18 = Compiler::get_declared_capabilities((Compiler *)this);
  pCVar1 = VectorView<spv::Capability>::begin(&local_18->super_VectorView<spv::Capability>);
  pCVar2 = VectorView<spv::Capability>::end(&local_18->super_VectorView<spv::Capability>);
  local_1c = CapabilityRayQueryKHR;
  pCVar1 = ::std::find<spv::Capability_const*,spv::Capability>(pCVar1,pCVar2,&local_1c);
  pCVar2 = VectorView<spv::Capability>::end(&local_18->super_VectorView<spv::Capability>);
  return pCVar1 != pCVar2;
}

Assistant:

bool CompilerMSL::is_intersection_query() const
{
	auto &caps = get_declared_capabilities();
	return std::find(caps.begin(), caps.end(), CapabilityRayQueryKHR) != caps.end();
}